

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leveldbutil.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  long in_RSI;
  int in_EDI;
  string command;
  bool ok;
  Env *env;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator<char> local_41;
  string local_40 [16];
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar2;
  byte bVar3;
  
  leveldb::Env::Default();
  uVar2 = 1;
  if (in_EDI < 2) {
    Usage();
    bVar3 = 0;
  }
  else {
    __lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_RSI + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,
               in_stack_ffffffffffffffd0);
    std::allocator<char>::~allocator(&local_41);
    bVar1 = std::operator==(__lhs,in_stack_ffffffffffffffa8);
    if (bVar1) {
      bVar3 = leveldb::anon_unknown_2::HandleDumpCommand
                        ((Env *)command.field_2._8_8_,(char **)command.field_2._M_allocated_capacity
                         ,command._M_string_length._4_4_);
    }
    else {
      Usage();
      bVar3 = false;
    }
    std::__cxx11::string::~string(local_40);
  }
  return (uint)((bVar3 & 1) == 0);
}

Assistant:

int main(int argc, char** argv) {
  leveldb::Env* env = leveldb::Env::Default();
  bool ok = true;
  if (argc < 2) {
    Usage();
    ok = false;
  } else {
    std::string command = argv[1];
    if (command == "dump") {
      ok = leveldb::HandleDumpCommand(env, argv + 2, argc - 2);
    } else {
      Usage();
      ok = false;
    }
  }
  return (ok ? 0 : 1);
}